

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
::push_back(vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
            *this,LensElementInterface *value)

{
  LensElementInterface *pLVar1;
  size_t sVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  size_t sVar6;
  
  sVar2 = this->nAlloc;
  sVar6 = this->nStored;
  if (sVar2 == sVar6) {
    sVar6 = 4;
    if (sVar2 != 0) {
      sVar6 = sVar2 * 2;
    }
    reserve(this,sVar6);
    sVar6 = this->nStored;
  }
  FVar3 = value->thickness;
  FVar4 = value->eta;
  FVar5 = value->apertureRadius;
  pLVar1 = this->ptr + sVar6;
  pLVar1->curvatureRadius = value->curvatureRadius;
  pLVar1->thickness = FVar3;
  pLVar1->eta = FVar4;
  pLVar1->apertureRadius = FVar5;
  this->nStored = this->nStored + 1;
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }